

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_PeepTest_x_iutest_x_StaticFunction_Test::Body
          (iu_PeepTest_x_iutest_x_StaticFunction_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_PeepTest_x_iutest_x_StaticFunction_Test *this_local;
  
  iutest_ar._32_8_ = this;
  (*iutest::detail::peep_tag<test::prod_test::iu_peep_tag_SetY<test::prod_test::ProdClass>>::value)
            (100);
  iutest::detail::AlwaysZero();
  local_40[1] = 100;
  local_40[0] = ProdClass::GetY();
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"100","ProdClass::GetY()",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x121,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(PeepTest, StaticFunction)
{
    IUTEST_PEEP_STATIC_GET(ProdClass, SetY)(100);
    IUTEST_EXPECT_EQ(100, ProdClass::GetY());
}